

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void interactiveMode(void)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  element_type *peVar4;
  bool bVar5;
  uint __val;
  string *psVar6;
  element_type *this;
  SpinLock SVar7;
  pointer pPVar8;
  undefined8 uVar9;
  char cVar10;
  char cVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  StepRunResult SVar15;
  undefined4 extraout_var;
  undefined8 *puVar16;
  long *plVar17;
  char *pcVar18;
  size_t sVar19;
  char *pcVar20;
  size_t sVar21;
  IllegalArgumentException *pIVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int *piVar24;
  undefined4 extraout_var_02;
  ThreadId TVar25;
  undefined8 uVar26;
  uint uVar27;
  size_type *psVar28;
  size_t *psVar29;
  pointer pSVar30;
  undefined1 auVar31 [8];
  size_t *psVar32;
  ulong uVar33;
  pointer pBVar34;
  ulong uVar35;
  size_type *psVar36;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_00;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_01;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_02;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_03;
  _Alloc_hider _Var37;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar38;
  iterator __begin1;
  ulong uVar39;
  undefined8 __it;
  pointer pcVar40;
  long lVar41;
  byte *pbVar42;
  iterator __position;
  uint uVar43;
  long lVar44;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::Script> __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [8];
  tuple<Target,_unsigned_long> e;
  undefined1 local_338 [16];
  IErrorReceiver local_328;
  IErrorReceiverBridge errorReceiver;
  INullErrorReceiver nullErrorReceiver;
  value_type cmd;
  undefined1 local_2d8 [16];
  size_type *local_2c8;
  string lines;
  vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_> lines_1;
  shared_ptr<chatra::StringTable> sTable;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  size_type *local_260;
  pointer local_258;
  size_type local_250;
  size_type sStack_248;
  undefined1 local_240 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  _Map_pointer local_218;
  undefined1 local_210;
  undefined7 uStack_20f;
  _Elt_pointer pbStack_208;
  _Elt_pointer local_200;
  _Elt_pointer local_1f8;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [8];
  string subLine;
  string line;
  vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_> packages;
  const_iterator it1;
  int local_178;
  uint local_174;
  undefined1 local_170 [8];
  string fileName;
  undefined1 local_148 [8];
  string packageName;
  string __str;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> verb;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  uint local_68;
  undefined1 local_58 [8];
  string vName;
  bool hasPackageName;
  
  signal(2,signalHandler);
  rl_bind_key(9,rl_insert);
  stifle_history(1000);
  iVar13 = (*(runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_Runtime[10])();
  interactiveInstanceId = CONCAT44(extraout_var,iVar13);
  dLog(0,"Chatra interactive frontend");
  dLog(0,"type \"!h\" to show debugger command help");
  local_2c8 = &lines._M_string_length;
  lines._M_dataplus._M_p = (pointer)0x0;
  lines._M_string_length._0_1_ = 0;
  subLine.field_2._8_8_ = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  uVar43 = 1;
  local_174 = 0;
  bVar12 = false;
  __val = 0;
  do {
    if ((prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_ == '\0') &&
       (iVar13 = __cxa_guard_acquire(&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_),
       iVar13 != 0)) {
      prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_ = &DAT_0024b6a8;
      _DAT_0024b6a0 = 0;
      DAT_0024b6a8 = 0;
      __cxa_atexit(std::__cxx11::string::~string,
                   &prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_);
    }
    if (optEnableColor == '\0') {
      if (bVar12) {
        cVar11 = '\x01';
        if (9 < uVar43) {
          uVar35 = (ulong)uVar43;
          cVar10 = '\x04';
          do {
            cVar11 = cVar10;
            uVar27 = (uint)uVar35;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00112dca;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00112dca;
            }
            if (uVar27 < 10000) goto LAB_00112dca;
            uVar35 = uVar35 / 10000;
            cVar10 = cVar11 + '\x04';
          } while (99999 < uVar27);
          cVar11 = cVar11 + '\x01';
        }
LAB_00112dca:
        local_58 = (undefined1  [8])&vName._M_string_length;
        std::__cxx11::string::_M_construct((ulong)local_58,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_58,(uint)vName._M_dataplus._M_p,uVar43);
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1d058c);
        local_a8 = (undefined1  [8])&verb._M_string_length;
        psVar28 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar28) {
          verb._M_string_length = *psVar28;
          verb.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          verb._M_string_length = *psVar28;
          local_a8 = (undefined1  [8])*puVar16;
        }
        verb._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar28;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar17 = (long *)std::__cxx11::string::append(local_a8);
        goto LAB_00112e6b;
      }
      if ((local_174 & 1) == 0) {
        cVar11 = '\x01';
        if (9 < __val) {
          cVar10 = '\x04';
          uVar27 = __val;
          do {
            cVar11 = cVar10;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_001132ca;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_001132ca;
            }
            if (uVar27 < 10000) goto LAB_001132ca;
            bVar5 = 99999 < uVar27;
            cVar10 = cVar11 + '\x04';
            uVar27 = uVar27 / 10000;
          } while (bVar5);
          cVar11 = cVar11 + '\x01';
        }
LAB_001132ca:
        local_170 = (undefined1  [8])&fileName._M_string_length;
        std::__cxx11::string::_M_construct((ulong)local_170,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_170,(uint)fileName._M_dataplus._M_p,__val);
        plVar17 = (long *)std::__cxx11::string::replace((ulong)local_170,0,(char *)0x0,0x1d05af);
        local_148 = (undefined1  [8])&packageName._M_string_length;
        pSVar30 = (pointer)(plVar17 + 2);
        if ((pointer)*plVar17 == pSVar30) {
          packageName._M_string_length = (size_type)(pSVar30->name)._M_dataplus._M_p;
          packageName.field_2._M_allocated_capacity = plVar17[3];
        }
        else {
          packageName._M_string_length = (size_type)(pSVar30->name)._M_dataplus._M_p;
          local_148 = (undefined1  [8])*plVar17;
        }
        packageName._M_dataplus._M_p = (pointer)plVar17[1];
        *plVar17 = (long)pSVar30;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append(local_148);
        local_58 = (undefined1  [8])&vName._M_string_length;
        psVar28 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar28) {
          vName._M_string_length = *psVar28;
          vName.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          vName._M_string_length = *psVar28;
          local_58 = (undefined1  [8])*puVar16;
        }
        vName._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar28;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cVar11 = '\x01';
        if (9 < uVar43) {
          uVar35 = (ulong)uVar43;
          cVar10 = '\x04';
          do {
            cVar11 = cVar10;
            uVar27 = (uint)uVar35;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00113530;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00113530;
            }
            if (uVar27 < 10000) goto LAB_00113530;
            uVar35 = uVar35 / 10000;
            cVar10 = cVar11 + '\x04';
          } while (99999 < uVar27);
          cVar11 = cVar11 + '\x01';
        }
LAB_00113530:
        packageName.field_2._8_8_ = &__str._M_string_length;
        std::__cxx11::string::_M_construct((ulong)((long)&packageName.field_2 + 8),cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)packageName.field_2._8_8_,(uint)__str._M_dataplus._M_p,uVar43);
        pcVar40 = (pointer)0xf;
        if (local_58 != (undefined1  [8])&vName._M_string_length) {
          pcVar40 = (pointer)vName._M_string_length;
        }
        if (pcVar40 < vName._M_dataplus._M_p +
                      CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)) {
          pcVar40 = (pointer)0xf;
          if ((size_type *)packageName.field_2._8_8_ != &__str._M_string_length) {
            pcVar40 = (pointer)__str._M_string_length;
          }
          if (pcVar40 < vName._M_dataplus._M_p +
                        CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p))
          goto LAB_001135a7;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)((long)&packageName.field_2 + 8),0,(char *)0x0,(ulong)local_58
                              );
        }
        else {
LAB_001135a7:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append(local_58,packageName.field_2._8_8_);
        }
        local_a8 = (undefined1  [8])&verb._M_string_length;
        psVar28 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar28) {
          verb._M_string_length = *psVar28;
          verb.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          verb._M_string_length = *psVar28;
          local_a8 = (undefined1  [8])*puVar16;
        }
        verb._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar28;
        puVar16[1] = 0;
        *(undefined1 *)psVar28 = 0;
        plVar17 = (long *)std::__cxx11::string::append(local_a8);
      }
      else {
        cVar11 = '\x01';
        if (9 < __val) {
          cVar10 = '\x04';
          uVar27 = __val;
          do {
            cVar11 = cVar10;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00113169;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00113169;
            }
            if (uVar27 < 10000) goto LAB_00113169;
            bVar5 = 99999 < uVar27;
            cVar10 = cVar11 + '\x04';
            uVar27 = uVar27 / 10000;
          } while (bVar5);
          cVar11 = cVar11 + '\x01';
        }
LAB_00113169:
        local_170 = (undefined1  [8])&fileName._M_string_length;
        std::__cxx11::string::_M_construct((ulong)local_170,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_170,(uint)fileName._M_dataplus._M_p,__val);
        plVar17 = (long *)std::__cxx11::string::replace((ulong)local_170,0,(char *)0x0,0x1d059e);
        local_148 = (undefined1  [8])&packageName._M_string_length;
        pSVar30 = (pointer)(plVar17 + 2);
        if ((pointer)*plVar17 == pSVar30) {
          packageName._M_string_length = (size_type)(pSVar30->name)._M_dataplus._M_p;
          packageName.field_2._M_allocated_capacity = plVar17[3];
        }
        else {
          packageName._M_string_length = (size_type)(pSVar30->name)._M_dataplus._M_p;
          local_148 = (undefined1  [8])*plVar17;
        }
        packageName._M_dataplus._M_p = (pointer)plVar17[1];
        *plVar17 = (long)pSVar30;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append(local_148);
        local_58 = (undefined1  [8])&vName._M_string_length;
        psVar28 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar28) {
          vName._M_string_length = *psVar28;
          vName.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          vName._M_string_length = *psVar28;
          local_58 = (undefined1  [8])*puVar16;
        }
        vName._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar28;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cVar11 = '\x01';
        if (9 < uVar43) {
          uVar35 = (ulong)uVar43;
          cVar10 = '\x04';
          do {
            cVar11 = cVar10;
            uVar27 = (uint)uVar35;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_0011342b;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_0011342b;
            }
            if (uVar27 < 10000) goto LAB_0011342b;
            uVar35 = uVar35 / 10000;
            cVar10 = cVar11 + '\x04';
          } while (99999 < uVar27);
          cVar11 = cVar11 + '\x01';
        }
LAB_0011342b:
        packageName.field_2._8_8_ = &__str._M_string_length;
        std::__cxx11::string::_M_construct((ulong)((long)&packageName.field_2 + 8),cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)packageName.field_2._8_8_,(uint)__str._M_dataplus._M_p,uVar43);
        pcVar40 = (pointer)0xf;
        if (local_58 != (undefined1  [8])&vName._M_string_length) {
          pcVar40 = (pointer)vName._M_string_length;
        }
        if (pcVar40 < vName._M_dataplus._M_p +
                      CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)) {
          pcVar40 = (pointer)0xf;
          if ((size_type *)packageName.field_2._8_8_ != &__str._M_string_length) {
            pcVar40 = (pointer)__str._M_string_length;
          }
          if (pcVar40 < vName._M_dataplus._M_p +
                        CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p))
          goto LAB_001134a2;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)((long)&packageName.field_2 + 8),0,(char *)0x0,(ulong)local_58
                              );
        }
        else {
LAB_001134a2:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append(local_58,packageName.field_2._8_8_);
        }
        local_a8 = (undefined1  [8])&verb._M_string_length;
        psVar28 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar28) {
          verb._M_string_length = *psVar28;
          verb.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          verb._M_string_length = *psVar28;
          local_a8 = (undefined1  [8])*puVar16;
        }
        verb._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar28;
        puVar16[1] = 0;
        *(undefined1 *)psVar28 = 0;
        plVar17 = (long *)std::__cxx11::string::append(local_a8);
      }
LAB_0011362e:
      psVar32 = &args.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size;
      psVar29 = (size_t *)(plVar17 + 2);
      if ((size_t *)*plVar17 == psVar29) {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar29;
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)plVar17[3];
        __str.field_2._8_8_ = psVar32;
      }
      else {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar29;
        __str.field_2._8_8_ = (size_t *)*plVar17;
      }
      args.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)plVar17[1];
      *plVar17 = (long)psVar29;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_,
                 (string *)(__str.field_2._M_local_buf + 8));
      if ((size_t *)__str.field_2._8_8_ != psVar32) {
        operator_delete((void *)__str.field_2._8_8_);
      }
      if (local_a8 != (undefined1  [8])&verb._M_string_length) {
        operator_delete((void *)local_a8);
      }
      if ((size_type *)packageName.field_2._8_8_ != &__str._M_string_length) {
        operator_delete((void *)packageName.field_2._8_8_);
      }
      if (local_58 != (undefined1  [8])&vName._M_string_length) {
        operator_delete((void *)local_58);
      }
      if (local_148 != (undefined1  [8])&packageName._M_string_length) {
        operator_delete((void *)local_148);
      }
      psVar6 = &fileName;
      auVar31 = local_170;
    }
    else {
      cVar11 = '\x01';
      if (!bVar12) {
        if (9 < __val) {
          cVar10 = '\x04';
          uVar27 = __val;
          do {
            cVar11 = cVar10;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00112f08;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00112f08;
            }
            if (uVar27 < 10000) goto LAB_00112f08;
            bVar5 = 99999 < uVar27;
            cVar10 = cVar11 + '\x04';
            uVar27 = uVar27 / 10000;
          } while (bVar5);
          cVar11 = cVar11 + '\x01';
        }
LAB_00112f08:
        local_170 = (undefined1  [8])&fileName._M_string_length;
        std::__cxx11::string::_M_construct((ulong)local_170,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_170,(uint)fileName._M_dataplus._M_p,__val);
        plVar17 = (long *)std::__cxx11::string::replace((ulong)local_170,0,(char *)0x0,0x1d05a4);
        local_148 = (undefined1  [8])&packageName._M_string_length;
        pSVar30 = (pointer)(plVar17 + 2);
        if ((pointer)*plVar17 == pSVar30) {
          packageName._M_string_length = (size_type)(pSVar30->name)._M_dataplus._M_p;
          packageName.field_2._M_allocated_capacity = plVar17[3];
        }
        else {
          packageName._M_string_length = (size_type)(pSVar30->name)._M_dataplus._M_p;
          local_148 = (undefined1  [8])*plVar17;
        }
        packageName._M_dataplus._M_p = (pointer)plVar17[1];
        *plVar17 = (long)pSVar30;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append(local_148);
        local_58 = (undefined1  [8])&vName._M_string_length;
        psVar28 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar28) {
          vName._M_string_length = *psVar28;
          vName.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          vName._M_string_length = *psVar28;
          local_58 = (undefined1  [8])*puVar16;
        }
        vName._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar28;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cVar11 = '\x01';
        if (9 < uVar43) {
          uVar35 = (ulong)uVar43;
          cVar10 = '\x04';
          do {
            cVar11 = cVar10;
            uVar27 = (uint)uVar35;
            if (uVar27 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00113057;
            }
            if (uVar27 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00113057;
            }
            if (uVar27 < 10000) goto LAB_00113057;
            uVar35 = uVar35 / 10000;
            cVar10 = cVar11 + '\x04';
          } while (99999 < uVar27);
          cVar11 = cVar11 + '\x01';
        }
LAB_00113057:
        packageName.field_2._8_8_ = &__str._M_string_length;
        std::__cxx11::string::_M_construct((ulong)((long)&packageName.field_2 + 8),cVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)packageName.field_2._8_8_,(uint)__str._M_dataplus._M_p,uVar43);
        pcVar40 = (pointer)0xf;
        if (local_58 != (undefined1  [8])&vName._M_string_length) {
          pcVar40 = (pointer)vName._M_string_length;
        }
        if (pcVar40 < vName._M_dataplus._M_p +
                      CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)) {
          pcVar40 = (pointer)0xf;
          if ((size_type *)packageName.field_2._8_8_ != &__str._M_string_length) {
            pcVar40 = (pointer)__str._M_string_length;
          }
          if (pcVar40 < vName._M_dataplus._M_p +
                        CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p))
          goto LAB_001130ce;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)((long)&packageName.field_2 + 8),0,(char *)0x0,(ulong)local_58
                              );
        }
        else {
LAB_001130ce:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append(local_58,packageName.field_2._8_8_);
        }
        local_a8 = (undefined1  [8])&verb._M_string_length;
        psVar28 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar28) {
          verb._M_string_length = *psVar28;
          verb.field_2._M_allocated_capacity = puVar16[3];
        }
        else {
          verb._M_string_length = *psVar28;
          local_a8 = (undefined1  [8])*puVar16;
        }
        verb._M_dataplus._M_p = (pointer)puVar16[1];
        *puVar16 = psVar28;
        puVar16[1] = 0;
        *(undefined1 *)psVar28 = 0;
        plVar17 = (long *)std::__cxx11::string::append(local_a8);
        goto LAB_0011362e;
      }
      if (9 < uVar43) {
        uVar35 = (ulong)uVar43;
        cVar10 = '\x04';
        do {
          cVar11 = cVar10;
          uVar27 = (uint)uVar35;
          if (uVar27 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_00112d22;
          }
          if (uVar27 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_00112d22;
          }
          if (uVar27 < 10000) goto LAB_00112d22;
          uVar35 = uVar35 / 10000;
          cVar10 = cVar11 + '\x04';
        } while (99999 < uVar27);
        cVar11 = cVar11 + '\x01';
      }
LAB_00112d22:
      local_58 = (undefined1  [8])&vName._M_string_length;
      std::__cxx11::string::_M_construct((ulong)local_58,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_58,(uint)vName._M_dataplus._M_p,uVar43);
      puVar16 = (undefined8 *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1d0592);
      local_a8 = (undefined1  [8])&verb._M_string_length;
      psVar28 = puVar16 + 2;
      if ((size_type *)*puVar16 == psVar28) {
        verb._M_string_length = *psVar28;
        verb.field_2._M_allocated_capacity = puVar16[3];
      }
      else {
        verb._M_string_length = *psVar28;
        local_a8 = (undefined1  [8])*puVar16;
      }
      verb._M_dataplus._M_p = (pointer)puVar16[1];
      *puVar16 = psVar28;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append(local_a8);
LAB_00112e6b:
      psVar32 = &args.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size;
      psVar29 = (size_t *)(plVar17 + 2);
      if ((size_t *)*plVar17 == psVar29) {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar29;
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)plVar17[3];
        __str.field_2._8_8_ = psVar32;
      }
      else {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar29;
        __str.field_2._8_8_ = (size_t *)*plVar17;
      }
      args.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)plVar17[1];
      *plVar17 = (long)psVar29;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_,
                 (string *)(__str.field_2._M_local_buf + 8));
      if ((size_t *)__str.field_2._8_8_ != psVar32) {
        operator_delete((void *)__str.field_2._8_8_);
      }
      if (local_a8 != (undefined1  [8])&verb._M_string_length) {
        operator_delete((void *)local_a8);
      }
      psVar6 = &vName;
      auVar31 = local_58;
    }
    if (auVar31 != (undefined1  [8])&psVar6->_M_string_length) {
      operator_delete((void *)auVar31);
    }
    pcVar18 = (char *)readline(prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_);
    sVar19 = strlen(pcVar18);
    if (sVar19 == 0) {
      iVar13 = 2;
    }
    else {
      iVar13 = 0;
      uVar35 = 0;
      do {
        if (pcVar18[uVar35] == '\t') {
          iVar13 = iVar13 + 1;
        }
        else if (((pcVar18[uVar35] == ' ' && uVar35 + 3 < sVar19) && (pcVar18[uVar35 + 1] == ' '))
                && (pcVar18[uVar35 + 2] == ' ')) {
          lVar41 = uVar35 + 3;
          uVar39 = uVar35 + 3;
          if (pcVar18[lVar41] != ' ') {
            uVar39 = uVar35;
          }
          uVar35 = uVar39;
          iVar13 = iVar13 + (uint)(pcVar18[lVar41] == ' ');
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 < sVar19);
      iVar13 = iVar13 + 2;
    }
    local_1e0 = (undefined1  [8])&subLine._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,pcVar18,pcVar18 + sVar19);
    if ((bool)(bVar12 & iVar13 != 0)) {
      do {
        std::__cxx11::string::_M_replace_aux((ulong)local_1e0,0,0,'\x01');
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    psVar28 = (size_type *)(subLine._M_dataplus._M_p + (long)local_1e0);
    auVar31 = local_1e0;
    if (0 < (long)subLine._M_dataplus._M_p >> 2) {
      auVar31 = (undefined1  [8])
                (((ulong)subLine._M_dataplus._M_p & 0xfffffffffffffffc) + (long)local_1e0);
      lVar41 = ((long)subLine._M_dataplus._M_p >> 2) + 1;
      psVar36 = (size_type *)((long)local_1e0 + 3);
      do {
        if ((0x20 < (ulong)*(byte *)((long)psVar36 + -3)) ||
           ((0x100000600U >> ((ulong)*(byte *)((long)psVar36 + -3) & 0x3f) & 1) == 0)) {
          psVar36 = (size_type *)((long)psVar36 + -3);
          goto LAB_001138f0;
        }
        if ((0x20 < (ulong)*(byte *)((long)psVar36 + -2)) ||
           ((0x100000600U >> ((ulong)*(byte *)((long)psVar36 + -2) & 0x3f) & 1) == 0)) {
          psVar36 = (size_type *)((long)psVar36 + -2);
          goto LAB_001138f0;
        }
        if ((0x20 < (ulong)*(byte *)((long)psVar36 + -1)) ||
           ((0x100000600U >> ((ulong)*(byte *)((long)psVar36 + -1) & 0x3f) & 1) == 0)) {
          psVar36 = (size_type *)((long)psVar36 + -1);
          goto LAB_001138f0;
        }
        if ((0x20 < (ulong)(byte)*psVar36) ||
           ((0x100000600U >> ((ulong)(byte)*psVar36 & 0x3f) & 1) == 0)) goto LAB_001138f0;
        lVar41 = lVar41 + -1;
        psVar36 = (size_type *)((long)psVar36 + 4);
      } while (1 < lVar41);
    }
    lVar41 = (long)psVar28 - (long)auVar31;
    if (lVar41 == 1) {
LAB_001138c5:
      psVar36 = (size_type *)auVar31;
      if (((ulong)(byte)*(size_type *)auVar31 < 0x21) &&
         ((0x100000600U >> ((ulong)(byte)*(size_type *)auVar31 & 0x3f) & 1) != 0)) {
        psVar36 = psVar28;
      }
    }
    else if (lVar41 == 2) {
LAB_001138b3:
      psVar36 = (size_type *)auVar31;
      if (((ulong)(byte)*(size_type *)auVar31 < 0x21) &&
         ((0x100000600U >> ((ulong)(byte)*(size_type *)auVar31 & 0x3f) & 1) != 0)) {
        auVar31 = (undefined1  [8])((long)auVar31 + 1);
        goto LAB_001138c5;
      }
    }
    else {
      psVar36 = psVar28;
      if (((lVar41 == 3) &&
          (psVar36 = (size_type *)auVar31, (ulong)(byte)*(size_type *)auVar31 < 0x21)) &&
         ((0x100000600U >> ((ulong)(byte)*(size_type *)auVar31 & 0x3f) & 1) != 0)) {
        auVar31 = (undefined1  [8])((long)auVar31 + 1);
        goto LAB_001138b3;
      }
    }
LAB_001138f0:
    if (psVar28 != psVar36) {
      add_history();
    }
    if ((subLine._M_dataplus._M_p == (pointer)0x0) ||
       (((byte *)((long)local_1e0 - 1))[(long)subLine._M_dataplus._M_p] != 10)) {
      std::__cxx11::string::push_back((char)local_1e0);
    }
    uVar43 = uVar43 + 1;
    if ((subLine._M_dataplus._M_p < (pointer)0x2) ||
       (((byte *)((long)local_1e0 - 2))[(long)subLine._M_dataplus._M_p] != 0x5c)) {
      std::__cxx11::string::_M_append(subLine.field_2._M_local_buf + 8,(ulong)local_1e0);
      do {
        uVar35 = std::__cxx11::string::find(subLine.field_2._M_local_buf + 8,0x1d04d1,0);
        if (uVar35 == 0xffffffffffffffff) break;
        std::__cxx11::string::erase((ulong)(subLine.field_2._M_local_buf + 8),uVar35);
      } while (uVar35 != 0xffffffffffffffff);
      std::__cxx11::string::_M_append((char *)&local_2c8,subLine.field_2._8_8_);
      if ((local_174 & 1) == 0) {
        pcVar18 = line._M_dataplus._M_p + subLine.field_2._8_8_;
        uVar26 = subLine.field_2._8_8_;
        if (0 < (long)line._M_dataplus._M_p >> 2) {
          uVar26 = ((ulong)line._M_dataplus._M_p & 0xfffffffffffffffc) + subLine.field_2._8_8_;
          lVar41 = ((long)line._M_dataplus._M_p >> 2) + 1;
          pcVar20 = (char *)(subLine.field_2._8_8_ + 3);
          do {
            if ((pcVar20[-3] != ' ') && (pcVar20[-3] != '\t')) {
              pcVar20 = pcVar20 + -3;
              goto LAB_00113bc2;
            }
            if ((pcVar20[-2] != ' ') && (pcVar20[-2] != '\t')) {
              pcVar20 = pcVar20 + -2;
              goto LAB_00113bc2;
            }
            if ((pcVar20[-1] != ' ') && (pcVar20[-1] != '\t')) {
              pcVar20 = pcVar20 + -1;
              goto LAB_00113bc2;
            }
            if ((*pcVar20 != ' ') && (*pcVar20 != '\t')) goto LAB_00113bc2;
            lVar41 = lVar41 + -1;
            pcVar20 = pcVar20 + 4;
          } while (1 < lVar41);
        }
        lVar41 = (long)pcVar18 - uVar26;
        if (lVar41 == 1) {
LAB_00113b10:
          pcVar20 = (char *)uVar26;
          if (*(char *)uVar26 == '\t') {
            pcVar20 = pcVar18;
          }
          if (*(char *)uVar26 == ' ') {
            pcVar20 = pcVar18;
          }
        }
        else if (lVar41 == 2) {
LAB_00113b00:
          if ((*(char *)uVar26 == ' ') || (pcVar20 = (char *)uVar26, *(char *)uVar26 == '\t')) {
            uVar26 = uVar26 + 1;
            goto LAB_00113b10;
          }
        }
        else {
          pcVar20 = pcVar18;
          if ((lVar41 == 3) &&
             ((*(char *)uVar26 == ' ' || (pcVar20 = (char *)uVar26, *(char *)uVar26 == '\t')))) {
            uVar26 = uVar26 + 1;
            goto LAB_00113b00;
          }
        }
LAB_00113bc2:
        psVar32 = &args.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size;
        psVar6 = (string *)((long)&__str.field_2 + 8);
        __str.field_2._8_8_ = psVar32;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)psVar6,pcVar20);
        bVar12 = isBlockStatement(psVar6);
        if ((size_t *)__str.field_2._8_8_ != psVar32) {
          operator_delete((void *)__str.field_2._8_8_);
        }
        if (!bVar12) goto LAB_00113c26;
        line._M_dataplus._M_p = (pointer)0x0;
        *(undefined1 *)subLine.field_2._8_8_ = 0;
        local_174 = (uint)CONCAT71((int7)((ulong)subLine.field_2._8_8_ >> 8),1);
      }
      else if (line._M_dataplus._M_p < (pointer)0x2) {
        local_174 = 0;
LAB_00113c26:
        line._M_dataplus._M_p = (pointer)0x0;
        *(undefined1 *)subLine.field_2._8_8_ = 0;
        if (0 < (long)lines._M_dataplus._M_p >> 2) {
          lVar41 = ((long)lines._M_dataplus._M_p >> 2) + 1;
          pcVar18 = (char *)((long)local_2c8 + 3);
          do {
            if (((((pcVar18[-3] != ' ') && (pcVar18[-3] != '\t')) ||
                 ((pcVar18[-2] != ' ' && (pcVar18[-2] != '\t')))) ||
                ((pcVar18[-1] != ' ' && (pcVar18[-1] != '\t')))) ||
               ((*pcVar18 != ' ' && (*pcVar18 != '\t')))) break;
            lVar41 = lVar41 + -1;
            pcVar18 = pcVar18 + 4;
          } while (1 < lVar41);
        }
        std::__cxx11::string::substr((ulong)local_240,(ulong)&local_2c8);
        lines._M_dataplus._M_p = (pointer)0x0;
        *(char *)local_2c8 = '\0';
        pbVar1 = (byte *)((long)local_240 + (long)input._M_dataplus._M_p);
        auVar31 = local_240;
        if (0 < (long)input._M_dataplus._M_p >> 2) {
          auVar31 = (undefined1  [8])
                    ((long)local_240 + ((ulong)input._M_dataplus._M_p & 0xfffffffffffffffc));
          lVar41 = ((long)input._M_dataplus._M_p >> 2) + 1;
          pbVar42 = (byte *)((long)local_240 + 3);
          do {
            if ((0x20 < (ulong)pbVar42[-3]) ||
               ((0x100000600U >> ((ulong)pbVar42[-3] & 0x3f) & 1) == 0)) {
              pbVar42 = pbVar42 + -3;
              goto LAB_00113e5e;
            }
            if ((0x20 < (ulong)pbVar42[-2]) ||
               ((0x100000600U >> ((ulong)pbVar42[-2] & 0x3f) & 1) == 0)) {
              pbVar42 = pbVar42 + -2;
              goto LAB_00113e5e;
            }
            if ((0x20 < (ulong)pbVar42[-1]) ||
               ((0x100000600U >> ((ulong)pbVar42[-1] & 0x3f) & 1) == 0)) {
              pbVar42 = pbVar42 + -1;
              goto LAB_00113e5e;
            }
            if ((0x20 < (ulong)*pbVar42) || ((0x100000600U >> ((ulong)*pbVar42 & 0x3f) & 1) == 0))
            goto LAB_00113e5e;
            lVar41 = lVar41 + -1;
            pbVar42 = pbVar42 + 4;
          } while (1 < lVar41);
        }
        lVar41 = (long)pbVar1 - (long)auVar31;
        if (lVar41 == 1) {
LAB_00113e33:
          pbVar42 = (byte *)auVar31;
          if (((ulong)*(byte *)auVar31 < 0x21) &&
             ((0x100000600U >> ((ulong)*(byte *)auVar31 & 0x3f) & 1) != 0)) {
            pbVar42 = pbVar1;
          }
        }
        else if (lVar41 == 2) {
LAB_00113e21:
          pbVar42 = (byte *)auVar31;
          if (((ulong)*(byte *)auVar31 < 0x21) &&
             ((0x100000600U >> ((ulong)*(byte *)auVar31 & 0x3f) & 1) != 0)) {
            auVar31 = (undefined1  [8])((long)auVar31 + 1);
            goto LAB_00113e33;
          }
        }
        else {
          pbVar42 = pbVar1;
          if (((lVar41 == 3) && (pbVar42 = (byte *)auVar31, (ulong)*(byte *)auVar31 < 0x21)) &&
             ((0x100000600U >> ((ulong)*(byte *)auVar31 & 0x3f) & 1) != 0)) {
            auVar31 = (undefined1  [8])((long)auVar31 + 1);
            goto LAB_00113e21;
          }
        }
LAB_00113e5e:
        if (pbVar1 != pbVar42) {
          if (*(byte *)local_240 == 0x21) {
            chatra::StringTable::newInstance();
            errorReceiver._16_8_ = &PTR__IErrorReceiver_00245ec8;
            local_328._vptr_IErrorReceiver = (_func_int **)&PTR__IErrorReceiver_00245f18;
            errorReceiver.super_IErrorReceiver._vptr_IErrorReceiver =
                 (_func_int **)&errorReceiver.errorCount;
            errorReceiver.target._0_4_ = 0;
            __str.field_2._8_8_ =
                 &args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)((long)&__str.field_2 + 8),"(debugger-command)","");
            packageName.field_2._8_8_ = &__str._M_string_length;
            psVar6 = (string *)((long)&packageName.field_2 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar6,local_240,input._M_dataplus._M_p + (long)local_240);
            chatra::parseLines((vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                *)((long)&lines.field_2 + 8),&local_328,
                               (shared_ptr<chatra::StringTable> *)
                               &lines_1.
                                super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)((long)&__str.field_2 + 8),1,psVar6);
            if ((size_type *)packageName.field_2._8_8_ != &__str._M_string_length) {
              operator_delete((void *)packageName.field_2._8_8_);
            }
            if ((size_t *)__str.field_2._8_8_ !=
                &args.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size) {
              operator_delete((void *)__str.field_2._8_8_);
            }
            if (((((int)errorReceiver.target == 0) &&
                 ((pointer)lines.field_2._8_8_ !=
                  lines_1.
                  super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)) &&
                (lVar41 = *(long *)(*(long *)lines.field_2._8_8_ + 0x58),
                1 < (ulong)((*(long *)(*(long *)lines.field_2._8_8_ + 0x60) - lVar41 >> 4) *
                           -0x3333333333333333))) && (*(int *)(lVar41 + 0x78) == 1)) {
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size = 0;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
              __str.field_2._8_8_ = 0;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
              std::
              _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)((long)&__str.field_2 + 8),0);
              fileName.field_2._8_8_ =
                   lines_1.
                   super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              uVar26 = lines.field_2._8_8_;
              if ((pointer)lines.field_2._8_8_ !=
                  lines_1.
                  super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                do {
                  lVar3 = *(long *)(*(long *)uVar26 + 0x60);
                  for (lVar41 = *(long *)(*(long *)uVar26 + 0x58); lVar41 != lVar3;
                      lVar41 = lVar41 + 0x50) {
                    if (*(int *)(lVar41 + 0x28) == 2) {
                      if ((**(char **)(lVar41 + 0x30) != '\"') &&
                         (**(char **)(lVar41 + 0x30) != '\'')) {
                        pIVar22 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                        chatra::IllegalArgumentException::IllegalArgumentException
                                  (pIVar22,
                                   "string quotation pattern used with specified parameter is not supported"
                                  );
                        __cxa_throw(pIVar22,&chatra::IllegalArgumentException::typeinfo,
                                    chatra::NativeException::~NativeException);
                      }
                      local_a8 = (undefined1  [8])&verb._M_string_length;
                      verb._M_dataplus._M_p = (pointer)0x0;
                      verb._M_string_length = verb._M_string_length & 0xffffffffffffff00;
                      uVar35 = *(ulong *)(lVar41 + 0x38);
                      if (1 < uVar35) {
                        uVar39 = 1;
                        do {
                          bVar2 = *(byte *)(*(long *)(lVar41 + 0x30) + uVar39);
                          uVar33 = *(long *)(lVar41 + 0x30) + uVar39;
                          if (bVar2 == 0x5c) {
                            uVar43 = *(byte *)(uVar33 + 1) - 0x22;
                            if ((0x3a < uVar43) ||
                               ((0x400000000000021U >> ((ulong)uVar43 & 0x3f) & 1) == 0)) {
                              pIVar22 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                              chatra::IllegalArgumentException::IllegalArgumentException
                                        (pIVar22,"unknown escape sequence");
                              __cxa_throw(pIVar22,&chatra::IllegalArgumentException::typeinfo,
                                          chatra::NativeException::~NativeException);
                            }
                            std::__cxx11::string::_M_replace_aux
                                      ((ulong)local_a8,(ulong)verb._M_dataplus._M_p,0,'\x01');
                            uVar39 = uVar39 + 2;
                          }
                          else {
                            lVar44 = 1;
                            if ((((char)bVar2 < '\0') && (lVar44 = 2, (bVar2 & 0xe0) != 0xc0)) &&
                               (lVar44 = 3, (bVar2 & 0xf0) != 0xe0)) {
                              lVar44 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                            }
                            if ((uVar35 < lVar44 + uVar39) || (1 < (uint)lVar44)) {
                              lVar44 = 0;
                            }
                            std::__cxx11::string::replace
                                      ((ulong)local_a8,(ulong)verb._M_dataplus._M_p,(char *)0x0,
                                       uVar33);
                            uVar39 = uVar39 + lVar44;
                          }
                          uVar35 = *(ulong *)(lVar41 + 0x38);
                        } while (uVar39 < uVar35);
                      }
                      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)&__str.field_2 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a8);
LAB_00114326:
                      if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                        operator_delete((void *)local_a8);
                      }
                    }
                    else {
                      if (*(int *)(lVar41 + 0x28) != 0) {
                        peVar4 = lines_1.
                                 super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage[4].
                                 super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ;
                        local_a8 = (undefined1  [8])&verb._M_string_length;
                        lVar44 = *(long *)(&peVar4->containsError +
                                          (ulong)*(uint *)(lVar41 + 0x2c) * 0x20);
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_a8,lVar44,
                                   (&peVar4->fileName)[*(uint *)(lVar41 + 0x2c)]._M_dataplus._M_p +
                                   lVar44);
                        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&__str.field_2 + 8),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a8);
                        goto LAB_00114326;
                      }
                      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string&>
                                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                 )(__str.field_2._M_local_buf + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(lVar41 + 0x30));
                    }
                  }
                  uVar26 = uVar26 + 0x10;
                } while (uVar26 != fileName.field_2._8_8_);
              }
              pdVar38 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&__str.field_2 + 8);
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_front(pdVar38);
              nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver =
                   (IErrorReceiver)&cmd._M_string_length;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&nullErrorReceiver,
                         *(long *)args.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_map_size,
                         *(long *)(args.
                                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_map_size + 8) +
                         *(long *)args.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_map_size);
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_front(pdVar38);
              iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
              if ((iVar13 == 0) ||
                 (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver), iVar13 == 0))
              {
                dLog(0,"debugger command:");
                lVar41 = 0x10;
                do {
                  dLogC(1,"^!$%s %s",
                        *(undefined8 *)((long)&PTR_anon_var_dwarf_27d14_00245bc0 + lVar41),
                        *(undefined8 *)(&UNK_00245bc8 + lVar41));
                  dLog(2,"%s",*(undefined8 *)((long)&PTR_anon_var_dwarf_27fd7_00245bd0 + lVar41));
                  lVar41 = lVar41 + 0x18;
                } while (lVar41 != 400);
                goto LAB_00114aa5;
              }
              iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
              if (iVar13 == 0) {
                local_58 = (undefined1  [8])&vName._M_string_length;
                vName._M_dataplus._M_p = (pointer)0x0;
                vName._M_string_length = vName._M_string_length & 0xffffffffffffff00;
                if (1 < ((long)((long)args.
                                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_first -
                               args.
                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_map_size) >> 5) +
                        ((long)args.
                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node -
                         (long)args.
                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 5) +
                        ((((ulong)((long)args.
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_last -
                                  (long)args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1)
                        + (ulong)(args.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_last ==
                                 (_Elt_pointer)0x0)) * 0x10) {
                  lVar41 = (long)(args.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_map_size -
                                 (long)args.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5;
                  uVar35 = lVar41 + 1;
                  if (uVar35 < 0x10) {
                    pcVar18 = (char *)(args.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_map_size + 0x20);
                  }
                  else {
                    uVar39 = uVar35 >> 4 | 0xf000000000000000;
                    if (-1 < lVar41) {
                      uVar39 = uVar35 >> 4;
                    }
                    pcVar18 = (&(args.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_last)->_M_dataplus)
                              [uVar39]._M_p + (uVar35 + uVar39 * -0x10) * 0x20;
                  }
                  iVar13 = std::__cxx11::string::compare(pcVar18);
                  if (iVar13 == 0) {
                    std::__cxx11::string::_M_assign((string *)local_58);
                    pdVar38 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&__str.field_2 + 8);
                    std::
                    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::pop_front(pdVar38);
                    std::
                    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::pop_front(pdVar38);
                  }
                }
                consume<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,(string *)&nullErrorReceiver,
                           (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&__str.field_2 + 8));
                local_260 = &local_250;
                pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58;
                if (vName._M_dataplus._M_p == (pointer)0x0) {
                  pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_148;
                }
                pcVar40 = (pbVar23->_M_dataplus)._M_p;
                _Var37 = vName._M_dataplus;
                if (vName._M_dataplus._M_p == (pointer)0x0) {
                  _Var37 = packageName._M_dataplus;
                }
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_260,pcVar40,_Var37._M_p + (long)pcVar40);
                loadScript_abi_cxx11_
                          ((string *)
                           &sTable.
                            super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(char *)local_148);
                local_a8 = (undefined1  [8])&verb._M_string_length;
                if (local_260 == &local_250) {
                  verb.field_2._M_allocated_capacity = sStack_248;
                }
                else {
                  local_a8 = (undefined1  [8])local_260;
                }
                verb._M_string_length = CONCAT71(local_250._1_7_,(undefined1)local_250);
                verb.field_2._8_8_ = &local_78;
                verb._M_dataplus._M_p = local_258;
                local_258 = (pointer)0x0;
                local_250._0_1_ = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi == &local_270) {
                  local_78._8_8_ = local_270._8_8_;
                }
                else {
                  verb.field_2._8_8_ =
                       sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
                }
                local_78._M_allocated_capacity._1_7_ = local_270._M_allocated_capacity._1_7_;
                local_78._M_local_buf[0] = local_270._M_local_buf[0];
                local_270._M_local_buf[0] = '\0';
                __l_00._M_len = 1;
                __l_00._M_array = (iterator)local_a8;
                sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_270;
                local_260 = &local_250;
                std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
                          ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_170,
                           __l_00,(allocator_type *)
                                  &packages.
                                   super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)verb.field_2._8_8_ != &local_78) {
                  operator_delete((void *)verb.field_2._8_8_);
                }
                if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                  operator_delete((void *)local_a8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi != &local_270) {
                  operator_delete(sTable.
                                  super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi);
                }
                if (local_260 != &local_250) {
                  operator_delete(local_260);
                }
                verb._M_dataplus._M_p = (pointer)0x0;
                verb._M_string_length = verb._M_string_length & 0xffffffffffffff00;
                local_a8 = (undefined1  [8])&verb._M_string_length;
                Host::push(host.super___shared_ptr<Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (string *)local_a8,
                           (vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_170);
                if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                  operator_delete((void *)local_a8);
                }
                iVar13 = (*(runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_vptr_Runtime[7])
                                   (runtime.
                                    super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,local_170);
                iVar14 = (*(runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_vptr_Runtime[9])
                                   (runtime.
                                    super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,CONCAT44(extraout_var_00,iVar13));
                _Var37 = vName._M_dataplus;
                pcVar18 = "~file:$";
                if (vName._M_dataplus._M_p != (pointer)0x0) {
                  cmd.field_2._8_8_ = local_2d8;
                  psVar6 = (string *)(cmd.field_2._M_local_buf + 8);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)psVar6,local_58,(long)local_58 + vName._M_dataplus._M_p);
                  std::__cxx11::string::append((char *)psVar6);
                  escape((string *)
                         &e.super__Tuple_impl<0UL,_Target,_unsigned_long>.
                          super__Head_base<0UL,_Target,_false>,psVar6);
                  pcVar18 = (char *)e.super__Tuple_impl<0UL,_Target,_unsigned_long>._8_8_;
                }
                escape((string *)local_a8,(string *)local_148);
                dLogC(0,"\\[<I%zu>\\] <P%zu> %s %s",CONCAT44(extraout_var_01,iVar14),
                      CONCAT44(extraout_var_00,iVar13),pcVar18,local_a8);
                if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                  operator_delete((void *)local_a8);
                }
                if (_Var37._M_p != (pointer)0x0) {
                  if ((undefined1 *)e.super__Tuple_impl<0UL,_Target,_unsigned_long>._8_8_ !=
                      local_338) {
                    operator_delete((void *)e.super__Tuple_impl<0UL,_Target,_unsigned_long>._8_8_);
                  }
                  if ((undefined1 *)cmd.field_2._8_8_ != local_2d8) {
                    operator_delete((void *)cmd.field_2._8_8_);
                  }
                }
                std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
                          ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_170);
                if (local_148 != (undefined1  [8])&packageName._M_string_length) {
                  operator_delete((void *)local_148);
                }
                psVar6 = &vName;
                auVar31 = local_58;
LAB_00114f5a:
                if (auVar31 != (undefined1  [8])&psVar6->_M_string_length) {
                  operator_delete((void *)auVar31);
                }
              }
              else {
                iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                if (iVar13 == 0) {
                  LOCK();
                  interruptionState._M_i = Acceptable;
                  UNLOCK();
                  runUntilBreak();
LAB_00114bad:
                  LOCK();
                  interruptionState._M_i = Masked;
                  UNLOCK();
                }
                else {
                  iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                  if ((((iVar13 != 0) &&
                       (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                       iVar13 != 0)) &&
                      (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                      iVar13 != 0)) &&
                     ((iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                      iVar13 != 0 &&
                      (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                      iVar13 != 0)))) {
                    iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                    if ((iVar13 == 0) ||
                       ((iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                        iVar13 == 0 ||
                        (iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver),
                        iVar13 == 0)))) {
                      if ((args.
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node ==
                           (_Map_pointer)
                           args.
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_map_size) ||
                         (iVar13 = std::__cxx11::string::compare
                                             ((char *)args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_map_size),
                         iVar13 != 0)) {
                        puVar16 = (undefined8 *)__cxa_allocate_exception(0x28);
                        *puVar16 = 0;
                        puVar16[1] = 0;
                        puVar16[2] = 0;
                        puVar16[3] = 0;
                        puVar16[4] = 0;
                        puVar16[1] = puVar16 + 3;
                        puVar16[2] = 0;
                        *(undefined1 *)(puVar16 + 3) = 0;
                        *puVar16 = &PTR__NativeException_00245b18;
                        __cxa_throw(puVar16,&chatra::IllegalArgumentException::typeinfo,
                                    chatra::NativeException::~NativeException);
                      }
                      std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)((long)&__str.field_2 + 8));
                      local_148 = (undefined1  [8])&packageName._M_string_length;
                      packageName._M_dataplus._M_p = (pointer)0x0;
                      packageName._M_string_length =
                           packageName._M_string_length & 0xffffffffffffff00;
                      if (args.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node ==
                          (_Map_pointer)
                          args.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_map_size) {
LAB_0011502f:
                        if (1 < ((long)((long)args.
                                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_first -
                                       args.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_map_size) >> 5) +
                                ((long)args.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node -
                                 (long)args.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 5) +
                                ((((ulong)((long)args.
                                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Deque_impl_data._M_finish._M_last -
                                          (long)args.
                                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_last) >>
                                  3) - 1) +
                                (ulong)(args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_last ==
                                       (_Elt_pointer)0x0)) * 0x10) {
                          lVar41 = (long)(args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_map_size -
                                         (long)args.
                                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5
                          ;
                          uVar35 = lVar41 + 1;
                          if (uVar35 < 0x10) {
                            pcVar18 = (char *)(args.
                                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Deque_impl_data._M_map_size + 0x20);
                          }
                          else {
                            uVar39 = uVar35 >> 4 | 0xf000000000000000;
                            if (-1 < lVar41) {
                              uVar39 = uVar35 >> 4;
                            }
                            pcVar18 = (&(args.
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_last)->
                                        _M_dataplus)[uVar39]._M_p + (uVar35 + uVar39 * -0x10) * 0x20
                            ;
                          }
                          iVar13 = std::__cxx11::string::compare(pcVar18);
                          if (iVar13 == 0) {
                            vName.field_2._M_local_buf[0xf] = '\x01';
                            std::__cxx11::string::_M_assign((string *)local_148);
                            pdVar38 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)((long)&__str.field_2 + 8);
                            std::
                            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::pop_front(pdVar38);
                            std::
                            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::pop_front(pdVar38);
                          }
                        }
                      }
                      else {
                        uVar35 = (long)(args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_map_size -
                                       (long)args.
                                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5;
                        pcVar18 = (char *)args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_map_size;
                        if (0xf < uVar35) {
                          uVar39 = uVar35 >> 4 | 0xf000000000000000;
                          if (0 < (long)uVar35) {
                            uVar39 = uVar35 >> 4;
                          }
                          pcVar18 = (&(args.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_last)->
                                      _M_dataplus)[uVar39]._M_p + (uVar35 + uVar39 * -0x10) * 0x20;
                        }
                        iVar13 = std::__cxx11::string::compare(pcVar18);
                        if (iVar13 != 0) goto LAB_0011502f;
                        vName.field_2._M_local_buf[0xf] = '\x01';
                      }
                      if (((long)((long)args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_first -
                                 args.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_map_size) >> 5) +
                          ((long)args.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node -
                           (long)args.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 5) +
                          ((((ulong)((long)args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_finish._M_last -
                                    (long)args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) -
                           1) + (ulong)(args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_last ==
                                       (_Elt_pointer)0x0)) * 0x10 < 4) {
LAB_00115e9b:
                        puVar16 = (undefined8 *)__cxa_allocate_exception(0x28);
                        *puVar16 = 0;
                        puVar16[1] = 0;
                        puVar16[2] = 0;
                        puVar16[3] = 0;
                        puVar16[4] = 0;
                        puVar16[1] = puVar16 + 3;
                        puVar16[2] = 0;
                        *(undefined1 *)(puVar16 + 3) = 0;
                        *puVar16 = &PTR__NativeException_00245b18;
                        __cxa_throw(puVar16,&chatra::IllegalArgumentException::typeinfo,
                                    chatra::NativeException::~NativeException);
                      }
                      lVar41 = (long)(args.
                                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Deque_impl_data._M_map_size -
                                     (long)args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5;
                      uVar35 = lVar41 + 1;
                      if (uVar35 < 0x10) {
                        pcVar18 = (char *)(args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_map_size + 0x20);
                      }
                      else {
                        uVar39 = uVar35 >> 4 | 0xf000000000000000;
                        if (-1 < lVar41) {
                          uVar39 = uVar35 >> 4;
                        }
                        pcVar18 = (&(args.
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_last)->_M_dataplus)
                                  [uVar39]._M_p + (uVar35 + uVar39 * -0x10) * 0x20;
                      }
                      iVar13 = std::__cxx11::string::compare(pcVar18);
                      if (iVar13 != 0) goto LAB_00115e9b;
                      lVar41 = (long)(args.
                                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Deque_impl_data._M_map_size -
                                     (long)args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5;
                      uVar35 = lVar41 + 3;
                      if (uVar35 < 0x10) {
                        pcVar18 = (char *)(args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_map_size + 0x60);
                      }
                      else {
                        uVar39 = uVar35 >> 4 | 0xf000000000000000;
                        if (-3 < lVar41) {
                          uVar39 = uVar35 >> 4;
                        }
                        pcVar18 = (&(args.
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_last)->_M_dataplus)
                                  [uVar39]._M_p + (uVar35 + uVar39 * -0x10) * 0x20;
                      }
                      iVar13 = std::__cxx11::string::compare(pcVar18);
                      if (iVar13 != 0) goto LAB_00115e9b;
                      uVar35 = (long)(args.
                                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Deque_impl_data._M_map_size -
                                     (long)args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5;
                      plVar17 = (long *)args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_map_size;
                      if (0xf < uVar35) {
                        uVar39 = uVar35 >> 4 | 0xf000000000000000;
                        if (0 < (long)uVar35) {
                          uVar39 = uVar35 >> 4;
                        }
                        plVar17 = (long *)((&(args.
                                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_last)->
                                             _M_dataplus)[uVar39]._M_p +
                                          (uVar35 + uVar39 * -0x10) * 0x20);
                      }
                      local_170 = (undefined1  [8])&fileName._M_string_length;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_170,*plVar17,plVar17[1] + *plVar17);
                      pdVar38 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(&__str.field_2._M_allocated_capacity + 1);
                      std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_front(pdVar38);
                      std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_front(pdVar38);
                      local_58 = (undefined1  [8])&vName._M_string_length;
                      line.field_2._8_8_ = 0x19;
                      local_58 = (undefined1  [8])
                                 std::__cxx11::string::_M_create
                                           ((ulong *)local_58,(ulong)((long)&line.field_2 + 8));
                      vName._M_string_length = line.field_2._8_8_;
                      builtin_strncpy((char *)local_58,"line number in code point",0x19);
                      vName._M_dataplus._M_p = (pointer)line.field_2._8_8_;
                      *(char *)((long)local_58 + line.field_2._8_8_) = '\0';
                      uVar43 = consume<unsigned_int,_nullptr>((string *)local_58,pdVar38);
                      if (local_58 != (undefined1  [8])&vName._M_string_length) {
                        operator_delete((void *)local_58);
                      }
                      std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)((long)&__str.field_2 + 8));
                      (*(debugger.
                         super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_vptr_IDebugger[10])((undefined1 *)((long)&line.field_2 + 8));
                      pPVar8 = packages.
                               super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      uVar26 = line.field_2._8_8_;
                      if ((pointer)line.field_2._8_8_ ==
                          packages.
                          super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        pIVar22 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                        chatra::IllegalArgumentException::IllegalArgumentException
                                  (pIVar22,"no packages",local_148);
                        __cxa_throw(pIVar22,&chatra::IllegalArgumentException::typeinfo,
                                    chatra::NativeException::~NativeException);
                      }
                      do {
                        sortScripts(&((pointer)uVar26)->scripts);
                        uVar26 = uVar26 + 0x40;
                      } while ((pointer)uVar26 != pPVar8);
                      packages.
                      super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      local_58 = (undefined1  [8])((long)&vName.field_2 + 0xf);
                      vName._M_dataplus._M_p = local_148;
                      vName._M_string_length =
                           (size_type)
                           &packages.
                            super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      vName.field_2._M_allocated_capacity = (size_type)local_170;
                      fileName.field_2._8_8_ =
                           packages.
                           super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      lVar41 = (long)packages.
                                     super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                     ._M_impl.super__Vector_impl_data._M_start - line.field_2._8_8_
                               >> 8;
                      uVar26 = line.field_2._8_8_;
                      if (0 < lVar41) {
                        lVar41 = lVar41 + 1;
                        do {
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_58,
                                                (__normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                 )uVar26);
                          __it = uVar26;
                          if (bVar12) goto LAB_001156b0;
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_58,(PackageState *)(uVar26 + 0x40));
                          __it = (PackageState *)(uVar26 + 0x40);
                          if (bVar12) goto LAB_001156b0;
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_58,(PackageState *)(uVar26 + 0x80));
                          __it = (PackageState *)(uVar26 + 0x80);
                          if (bVar12) goto LAB_001156b0;
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_58,(PackageState *)(uVar26 + 0xc0));
                          __it = (PackageState *)(uVar26 + 0xc0);
                          if (bVar12) goto LAB_001156b0;
                          uVar26 = uVar26 + 0x100;
                          lVar41 = lVar41 + -1;
                        } while (1 < lVar41);
                      }
                      uVar9 = fileName.field_2._8_8_;
                      lVar41 = (long)(fileName.field_2._8_8_ - uVar26) >> 6;
                      if (lVar41 == 1) {
LAB_0011569e:
                        bVar12 = __gnu_cxx::__ops::
                                 _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                 ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                               *)local_58,
                                              (__normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                               )uVar26);
                        __it = uVar9;
                        if (bVar12) {
                          __it = uVar26;
                        }
                      }
                      else {
                        __it = uVar26;
                        if (lVar41 == 2) {
LAB_001154ff:
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_58,
                                                (__normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                 )__it);
                          if (!bVar12) {
                            uVar26 = __it + 0x40;
                            goto LAB_0011569e;
                          }
                        }
                        else {
                          __it = uVar9;
                          if ((lVar41 == 3) &&
                             (bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar26), __it = uVar26, !bVar12)) {
                            __it = uVar26 + 0x40;
                            goto LAB_001154ff;
                          }
                        }
                      }
LAB_001156b0:
                      if ((pointer)__it ==
                          packages.
                          super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        local_58 = (undefined1  [8])((long)&vName.field_2 + 0xf);
                        vName._M_dataplus._M_p = local_148;
                        vName._M_string_length =
                             (size_type)
                             &packages.
                              super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        vName.field_2._M_allocated_capacity = (size_type)local_170;
                        fileName.field_2._8_8_ =
                             packages.
                             super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                        lVar41 = (long)packages.
                                       super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                       ._M_impl.super__Vector_impl_data._M_start -
                                 line.field_2._8_8_ >> 8;
                        uVar26 = line.field_2._8_8_;
                        if (0 < lVar41) {
                          lVar41 = lVar41 + 1;
                          do {
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar26);
                            __it = uVar26;
                            if (bVar12) goto LAB_001157e2;
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,(PackageState *)(uVar26 + 0x40));
                            __it = (PackageState *)(uVar26 + 0x40);
                            if (bVar12) goto LAB_001157e2;
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,(PackageState *)(uVar26 + 0x80));
                            __it = (PackageState *)(uVar26 + 0x80);
                            if (bVar12) goto LAB_001157e2;
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,(PackageState *)(uVar26 + 0xc0));
                            __it = (PackageState *)(uVar26 + 0xc0);
                            if (bVar12) goto LAB_001157e2;
                            uVar26 = uVar26 + 0x100;
                            lVar41 = lVar41 + -1;
                          } while (1 < lVar41);
                        }
                        uVar9 = fileName.field_2._8_8_;
                        lVar41 = (long)(fileName.field_2._8_8_ - uVar26) >> 6;
                        if (lVar41 != 1) {
                          if (lVar41 != 2) {
                            __it = uVar9;
                            if ((lVar41 != 3) ||
                               (bVar12 = __gnu_cxx::__ops::
                                         _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                         ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar26), __it = uVar26, bVar12))
                            goto LAB_001157e2;
                            uVar26 = uVar26 + 0x40;
                          }
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                 *)local_58,
                                                (__normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                 )uVar26);
                          __it = uVar26;
                          if (bVar12) goto LAB_001157e2;
                          uVar26 = uVar26 + 0x40;
                        }
                        bVar12 = __gnu_cxx::__ops::
                                 _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                 ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                               *)local_58,
                                              (__normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                               )uVar26);
                        __it = uVar9;
                        if (bVar12) {
                          __it = uVar26;
                        }
                      }
LAB_001157e2:
                      auVar31 = local_170;
                      if (((pointer)__it ==
                           packages.
                           super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                           ._M_impl.super__Vector_impl_data._M_start) &&
                         ((vName.field_2._M_local_buf[0xf] & 1U) != 0)) {
                        piVar24 = __errno_location();
                        iVar13 = *piVar24;
                        *piVar24 = 0;
                        lVar41 = strtol((char *)auVar31,(char **)local_58,10);
                        if (local_58 == auVar31) {
                          fileName.field_2._8_8_ = piVar24;
                          uVar26 = std::__throw_invalid_argument("stoi");
                          __clang_call_terminate(uVar26);
                        }
                        iVar14 = (int)lVar41;
                        if ((iVar14 != lVar41) || (*piVar24 == 0x22)) {
                          fileName.field_2._8_8_ = piVar24;
                          std::__throw_out_of_range("stoi");
                        }
                        if (*piVar24 == 0) {
                          *piVar24 = iVar13;
                        }
                        local_178 = iVar14;
                        if (iVar14 != -1) {
                          local_58 = (undefined1  [8])local_148;
                          vName._M_dataplus._M_p = (pointer)&local_178;
                          vName._M_string_length =
                               (size_type)
                               &packages.
                                super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          fileName.field_2._8_8_ =
                               packages.
                               super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                          lVar41 = (long)packages.
                                         super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                         ._M_impl.super__Vector_impl_data._M_start -
                                   line.field_2._8_8_ >> 8;
                          uVar26 = line.field_2._8_8_;
                          if (0 < lVar41) {
                            lVar41 = lVar41 + 1;
                            do {
                              bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar26);
                              __it = uVar26;
                              if (bVar12) goto LAB_0011597d;
                              bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,(PackageState *)(uVar26 + 0x40));
                              __it = (PackageState *)(uVar26 + 0x40);
                              if (bVar12) goto LAB_0011597d;
                              bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,(PackageState *)(uVar26 + 0x80));
                              __it = (PackageState *)(uVar26 + 0x80);
                              if (bVar12) goto LAB_0011597d;
                              bVar12 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,(PackageState *)(uVar26 + 0xc0));
                              __it = (PackageState *)(uVar26 + 0xc0);
                              if (bVar12) goto LAB_0011597d;
                              uVar26 = uVar26 + 0x100;
                              lVar41 = lVar41 + -1;
                            } while (1 < lVar41);
                          }
                          uVar9 = fileName.field_2._8_8_;
                          lVar41 = (long)(fileName.field_2._8_8_ - uVar26) >> 6;
                          if (lVar41 != 1) {
                            if (lVar41 != 2) {
                              __it = uVar9;
                              if ((lVar41 != 3) ||
                                 (bVar12 = __gnu_cxx::__ops::
                                           _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                           ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar26), __it = uVar26, bVar12))
                              goto LAB_0011597d;
                              uVar26 = uVar26 + 0x40;
                            }
                            bVar12 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_58,
                                                  (
                                                  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                  )uVar26);
                            __it = uVar26;
                            if (bVar12) goto LAB_0011597d;
                            uVar26 = uVar26 + 0x40;
                          }
                          bVar12 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                 *)local_58,
                                                (__normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
                                                 )uVar26);
                          __it = uVar9;
                          if (bVar12) {
                            __it = uVar26;
                          }
                        }
                      }
LAB_0011597d:
                      if ((pointer)__it ==
                          packages.
                          super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        pIVar22 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                        chatra::IllegalArgumentException::IllegalArgumentException
                                  (pIVar22,"file \"%s:%s\" is not found",local_148,local_170);
                        __cxa_throw(pIVar22,&chatra::IllegalArgumentException::typeinfo,
                                    chatra::NativeException::~NativeException);
                      }
                      local_a8 = (undefined1  [8])&verb._M_string_length;
                      verb._M_dataplus._M_p = (pointer)0x0;
                      verb._M_string_length = verb._M_string_length & 0xffffffffffffff00;
                      local_78._M_allocated_capacity =
                           local_78._M_allocated_capacity & 0xffffffffffffff00;
                      verb.field_2._8_8_ = &local_78;
                      std::__cxx11::string::_M_assign((string *)local_a8);
                      std::__cxx11::string::_M_assign((string *)(verb.field_2._M_local_buf + 8));
                      local_68 = uVar43;
                      std::
                      vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                      ::~vector((vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                 *)((long)&line.field_2 + 8));
                      if (local_170 != (undefined1  [8])&fileName._M_string_length) {
                        operator_delete((void *)local_170);
                      }
                      if (local_148 != (undefined1  [8])&packageName._M_string_length) {
                        operator_delete((void *)local_148);
                      }
                      iVar13 = (*(debugger.
                                  super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_IDebugger[8])
                                         (debugger.
                                          super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr,local_a8);
                      do {
                        SVar7.flag.super___atomic_flag_base._M_i =
                             lockBreak.flag.super___atomic_flag_base._M_i;
                        LOCK();
                        lockBreak.flag.super___atomic_flag_base._M_i =
                             (atomic_flag)(__atomic_flag_base)0x1;
                        UNLOCK();
                      } while ((__atomic_flag_base)SVar7.flag.super___atomic_flag_base._M_i != false
                              );
                      std::vector<BreakPointState,_std::allocator<BreakPointState>_>::emplace_back<>
                                (&breakPoints);
                      pBVar34 = breakPoints.
                                super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      breakPoints.
                      super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].breakPointId =
                           CONCAT44(extraout_var_02,iVar13);
                      std::__cxx11::string::operator=
                                ((string *)&pBVar34[-1].codePoint,(string *)local_a8);
                      std::__cxx11::string::operator=
                                ((string *)&pBVar34[-1].codePoint.fileName,
                                 (string *)(verb.field_2._M_local_buf + 8));
                      pBVar34[-1].codePoint.lineNo = local_68;
                      lockBreak.flag.super___atomic_flag_base._M_i =
                           (atomic_flag)(__atomic_flag_base)0x0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)verb.field_2._8_8_ != &local_78) {
                        operator_delete((void *)verb.field_2._8_8_);
                      }
                    }
                    else {
                      iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                      if (iVar13 == 0) {
                        local_a8 = (undefined1  [8])&verb._M_string_length;
                        verb._M_dataplus._M_p = (pointer)0x3;
                        verb._M_string_length = CONCAT44(verb._M_string_length._4_4_,0x6c6564);
                        consume<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                  (&local_378,(string *)local_a8,
                                   (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&__str.field_2 + 8));
                        parseTargetId((string *)local_358);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_378._M_dataplus._M_p != &local_378.field_2) {
                          operator_delete(local_378._M_dataplus._M_p);
                        }
                        auVar31 = local_358;
                        if ((int)e.super__Tuple_impl<0UL,_Target,_unsigned_long>.
                                 super__Tuple_impl<1UL,_unsigned_long>.
                                 super__Head_base<1UL,_unsigned_long,_false>._M_head_impl != 6) {
                          pIVar22 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar22,"required %s-ID","breakpoint");
                          __cxa_throw(pIVar22,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                          operator_delete((void *)local_a8);
                        }
                        do {
                          SVar7.flag.super___atomic_flag_base._M_i =
                               lockBreak.flag.super___atomic_flag_base._M_i;
                          LOCK();
                          lockBreak.flag.super___atomic_flag_base._M_i =
                               (atomic_flag)(__atomic_flag_base)0x1;
                          UNLOCK();
                        } while ((__atomic_flag_base)SVar7.flag.super___atomic_flag_base._M_i !=
                                 false);
                        lVar41 = ((long)breakPoints.
                                        super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)breakPoints.
                                        super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 -0x3333333333333333 >> 2;
                        pBVar34 = breakPoints.
                                  super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if (0 < lVar41) {
                          pBVar34 = breakPoints.
                                    super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar41 * 4;
                          lVar41 = lVar41 + 1;
                          __position._M_current =
                               breakPoints.
                               super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2;
                          do {
                            if ((undefined1  [8])__position._M_current[-2].breakPointId == auVar31)
                            {
                              __position._M_current = __position._M_current + -2;
                              goto LAB_00115d73;
                            }
                            if ((undefined1  [8])__position._M_current[-1].breakPointId == auVar31)
                            {
                              __position._M_current = __position._M_current + -1;
                              goto LAB_00115d73;
                            }
                            if ((undefined1  [8])(__position._M_current)->breakPointId == auVar31)
                            goto LAB_00115d73;
                            if ((undefined1  [8])__position._M_current[1].breakPointId == auVar31) {
                              __position._M_current = __position._M_current + 1;
                              goto LAB_00115d73;
                            }
                            lVar41 = lVar41 + -1;
                            __position._M_current = __position._M_current + 4;
                          } while (1 < lVar41);
                        }
                        lVar41 = ((long)breakPoints.
                                        super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar34
                                 >> 4) * -0x3333333333333333;
                        if (lVar41 == 1) {
LAB_0011568b:
                          __position._M_current = pBVar34;
                          if ((undefined1  [8])pBVar34->breakPointId != auVar31) {
                            __position._M_current =
                                 breakPoints.
                                 super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                          }
                        }
                        else if (lVar41 == 2) {
LAB_00115682:
                          __position._M_current = pBVar34;
                          if ((undefined1  [8])pBVar34->breakPointId != auVar31) {
                            pBVar34 = pBVar34 + 1;
                            goto LAB_0011568b;
                          }
                        }
                        else {
                          __position._M_current =
                               breakPoints.
                               super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                          if ((lVar41 == 3) &&
                             (__position._M_current = pBVar34,
                             (undefined1  [8])pBVar34->breakPointId != auVar31)) {
                            pBVar34 = pBVar34 + 1;
                            goto LAB_00115682;
                          }
                        }
LAB_00115d73:
                        if (__position._M_current ==
                            breakPoints.
                            super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                          pIVar22 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar22,"breakpoint B%zu is not found",auVar31);
                          __cxa_throw(pIVar22,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        (*(debugger.
                           super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_vptr_IDebugger[9])
                                  (debugger.
                                   super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,auVar31);
                        std::vector<BreakPointState,_std::allocator<BreakPointState>_>::_M_erase
                                  (&breakPoints,__position);
                        lockBreak.flag.super___atomic_flag_base._M_i =
                             (atomic_flag)(__atomic_flag_base)0x0;
                        goto LAB_00114aa5;
                      }
                      iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                      if (iVar13 != 0) {
                        iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                        if (iVar13 == 0) {
                          verb._M_string_length = 0x746e692070657473;
                          verb._M_dataplus._M_p = (pointer)0x9;
                          verb.field_2._M_allocated_capacity._0_2_ = 0x6f;
                          local_a8 = (undefined1  [8])&verb._M_string_length;
                          TVar25 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                             ((string *)local_a8,__str.field_2._M_local_buf + 8,
                                              args_00);
                          if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                            operator_delete((void *)local_a8);
                          }
                          LOCK();
                          interruptionState._M_i = Acceptable;
                          UNLOCK();
                          SVar15 = (*(debugger.
                                      super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_IDebugger[6])
                                             (debugger.
                                              super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr,TVar25);
                          showStepRunResult(TVar25,SVar15);
                        }
                        else {
                          iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                          if (iVar13 == 0) {
                            verb._M_string_length = 0x65766f2070657473;
                            verb._M_dataplus._M_p = (pointer)0x9;
                            verb.field_2._M_allocated_capacity._0_2_ = 0x72;
                            local_a8 = (undefined1  [8])&verb._M_string_length;
                            TVar25 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                               ((string *)local_a8,__str.field_2._M_local_buf + 8,
                                                args_01);
                            if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                              operator_delete((void *)local_a8);
                            }
                            LOCK();
                            interruptionState._M_i = Acceptable;
                            UNLOCK();
                            SVar15 = (*(debugger.
                                        super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->_vptr_IDebugger[5])
                                               (debugger.
                                                super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr,TVar25);
                            showStepRunResult(TVar25,SVar15);
                          }
                          else {
                            iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                            if (iVar13 != 0) {
                              iVar13 = std::__cxx11::string::compare((char *)&nullErrorReceiver);
                              if (iVar13 != 0) {
                                std::
                                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)((long)&__str.field_2 + 8),
                                             (value_type *)&nullErrorReceiver);
                                std::
                                _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::_Deque_base((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_a8,
                                              (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)((long)&__str.field_2 + 8));
                                show((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_a8);
                                goto LAB_00114b90;
                              }
                              verb._M_dataplus._M_p = (pointer)0x4;
                              verb._M_string_length =
                                   CONCAT35(verb._M_string_length._5_3_,0x6c6c696b);
                              local_a8 = (undefined1  [8])&verb._M_string_length;
                              TVar25 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                                 ((string *)local_a8,__str.field_2._M_local_buf + 8,
                                                  args_03);
                              if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                                operator_delete((void *)local_a8);
                              }
                              (*(debugger.
                                 super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_IDebugger[0x10])
                                        (debugger.
                                         super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,TVar25);
                              goto LAB_00114aa5;
                            }
                            verb._M_string_length = 0x74756f2070657473;
                            verb._M_dataplus._M_p = (pointer)0x8;
                            verb.field_2._M_allocated_capacity =
                                 verb.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            local_a8 = (undefined1  [8])&verb._M_string_length;
                            TVar25 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                               ((string *)local_a8,__str.field_2._M_local_buf + 8,
                                                args_02);
                            if (local_a8 != (undefined1  [8])&verb._M_string_length) {
                              operator_delete((void *)local_a8);
                            }
                            LOCK();
                            interruptionState._M_i = Acceptable;
                            UNLOCK();
                            SVar15 = (*(debugger.
                                        super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->_vptr_IDebugger[7])
                                               (debugger.
                                                super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr,TVar25);
                            showStepRunResult(TVar25,SVar15);
                          }
                        }
                        goto LAB_00114bad;
                      }
                      psVar28 = &vName._M_string_length;
                      vName._M_dataplus._M_p = (pointer)0x4;
                      vName._M_string_length = CONCAT35(vName._M_string_length._5_3_,0x70657473);
                      local_58 = (undefined1  [8])psVar28;
                      consume<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a8,(string *)local_58,
                                 (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)&__str.field_2 + 8));
                      pdVar38 = extraout_RDX;
                      if (local_58 != (undefined1  [8])psVar28) {
                        operator_delete((void *)local_58);
                        pdVar38 = extraout_RDX_00;
                      }
                      vName._M_dataplus._M_p = (pointer)0x4;
                      vName._M_string_length = CONCAT35(vName._M_string_length._5_3_,0x70657473);
                      local_58 = (undefined1  [8])psVar28;
                      TVar25 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                         ((string *)local_58,__str.field_2._M_local_buf + 8,pdVar38)
                      ;
                      if (local_58 != (undefined1  [8])psVar28) {
                        operator_delete((void *)local_58);
                      }
                      LOCK();
                      interruptionState._M_i = Acceptable;
                      UNLOCK();
                      iVar13 = std::__cxx11::string::compare(local_a8);
                      lVar41 = 0x30;
                      if ((iVar13 != 0) &&
                         (iVar13 = std::__cxx11::string::compare(local_a8), iVar13 != 0)) {
                        iVar13 = std::__cxx11::string::compare(local_a8);
                        if (iVar13 == 0) {
                          lVar41 = 0x28;
                        }
                        else {
                          iVar13 = std::__cxx11::string::compare(local_a8);
                          lVar41 = 0x38;
                          if (iVar13 != 0) {
                            pIVar22 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                            chatra::IllegalArgumentException::IllegalArgumentException
                                      (pIVar22,"unknown command: \"step %s\"",local_a8);
                            __cxa_throw(pIVar22,&chatra::IllegalArgumentException::typeinfo,
                                        chatra::NativeException::~NativeException);
                          }
                        }
                      }
                      SVar15 = (**(code **)((long)(debugger.
                                                  super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->_vptr_IDebugger + lVar41))
                                         (debugger.
                                          super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr,TVar25);
                      showStepRunResult(TVar25,SVar15);
                      LOCK();
                      interruptionState._M_i = Masked;
                      UNLOCK();
                    }
                    psVar6 = &verb;
                    auVar31 = local_a8;
                    goto LAB_00114f5a;
                  }
                  if (args.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node ==
                      (_Map_pointer)
                      args.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map_size) {
                    dLog(0,"package  instance  thread  frame  scope  object  breakpoint");
                  }
                  else {
                    std::
                    _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::_Deque_base((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_a8,
                                  (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)((long)&__str.field_2 + 8));
                    show((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_a8);
LAB_00114b90:
                    std::
                    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_a8);
                  }
                }
              }
LAB_00114aa5:
              if (nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver !=
                  (IErrorReceiver)&cmd._M_string_length) {
                operator_delete((void *)nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver)
                ;
              }
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&__str.field_2 + 8));
            }
            else {
              dError("syntax error (type \"!h\" to show help)");
            }
            std::
            vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>::
            ~vector((vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                     *)((long)&lines.field_2 + 8));
            if (sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
          }
          else {
            sVar21 = findToken((string *)local_240,0);
            if (sVar21 != 0) {
              pcVar18 = __str.field_2._M_local_buf + 8;
              std::__cxx11::string::substr((ulong)pcVar18,(ulong)local_240);
              iVar13 = std::__cxx11::string::compare(pcVar18);
              if ((iVar13 == 0) || (iVar13 = std::__cxx11::string::compare(pcVar18), iVar13 == 0)) {
                dError("warning: %s block on top-level was ignored since it has no effect in interactive mode."
                       ,__str.field_2._8_8_);
                if ((size_t *)__str.field_2._8_8_ !=
                    &args.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_map_size) {
                  operator_delete((void *)__str.field_2._8_8_);
                }
                goto LAB_00114a07;
              }
              if ((size_t *)__str.field_2._8_8_ !=
                  &args.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size) {
                operator_delete((void *)__str.field_2._8_8_);
              }
            }
            cVar11 = '\x01';
            if (9 < __val) {
              cVar10 = '\x04';
              uVar43 = __val;
              do {
                cVar11 = cVar10;
                if (uVar43 < 100) {
                  cVar11 = cVar11 + -2;
                  goto LAB_0011469d;
                }
                if (uVar43 < 1000) {
                  cVar11 = cVar11 + -1;
                  goto LAB_0011469d;
                }
                if (uVar43 < 10000) goto LAB_0011469d;
                bVar12 = 99999 < uVar43;
                cVar10 = cVar11 + '\x04';
                uVar43 = uVar43 / 10000;
              } while (bVar12);
              cVar11 = cVar11 + '\x01';
            }
LAB_0011469d:
            local_58 = (undefined1  [8])&vName._M_string_length;
            std::__cxx11::string::_M_construct((ulong)local_58,cVar11);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_58,(uint)vName._M_dataplus._M_p,__val);
            plVar17 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1d05a4);
            __str.field_2._8_8_ =
                 &args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size;
            psVar32 = (size_t *)(plVar17 + 2);
            if ((size_t *)*plVar17 == psVar32) {
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size = *psVar32;
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)plVar17[3];
            }
            else {
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size = *psVar32;
              __str.field_2._8_8_ = (size_t *)*plVar17;
            }
            args.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)plVar17[1];
            *plVar17 = (long)psVar32;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            puVar16 = (undefined8 *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
            local_a8 = (undefined1  [8])&verb._M_string_length;
            psVar28 = puVar16 + 2;
            if ((size_type *)*puVar16 == psVar28) {
              verb._M_string_length = *psVar28;
              verb.field_2._M_allocated_capacity = puVar16[3];
            }
            else {
              verb._M_string_length = *psVar28;
              local_a8 = (undefined1  [8])*puVar16;
            }
            verb._M_dataplus._M_p = (pointer)puVar16[1];
            *puVar16 = psVar28;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            if ((size_t *)__str.field_2._8_8_ !=
                &args.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size) {
              operator_delete((void *)__str.field_2._8_8_);
            }
            if (local_58 != (undefined1  [8])&vName._M_string_length) {
              operator_delete((void *)local_58);
            }
            this = host.super___shared_ptr<Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_58 = (undefined1  [8])&vName._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
            input.field_2._8_8_ = &local_210;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)((long)&input.field_2 + 8),local_a8,
                       verb._M_dataplus._M_p + (long)local_a8);
            local_200 = (_Elt_pointer)local_1f0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_200,local_240,input._M_dataplus._M_p + (long)local_240);
            __str.field_2._8_8_ =
                 &args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size;
            if ((undefined1 *)input.field_2._8_8_ == &local_210) {
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur = pbStack_208;
            }
            else {
              __str.field_2._8_8_ = input.field_2._8_8_;
            }
            args.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size = CONCAT71(uStack_20f,local_210);
            args.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_first =
                 (_Elt_pointer)
                 &args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
            args.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map = local_218;
            local_218 = (_Map_pointer)0x0;
            local_210 = 0;
            if (local_200 == (_Elt_pointer)local_1f0) {
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)local_1f0._8_8_;
            }
            else {
              args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first = local_200;
            }
            args.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node =
                 (_Map_pointer)CONCAT71(local_1f0._1_7_,local_1f0[0]);
            args.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last = local_1f8;
            local_1f8 = (_Elt_pointer)0x0;
            local_1f0[0] = 0;
            __l._M_len = 1;
            __l._M_array = (iterator)((long)&__str.field_2 + 8);
            input.field_2._8_8_ = &local_210;
            local_200 = (_Elt_pointer)local_1f0;
            std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
                      ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_148,__l,
                       (allocator_type *)local_170);
            Host::push(this,(string *)local_58,
                       (vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_148);
            std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
                      ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_148);
            if (args.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first !=
                (_Elt_pointer)
                &args.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node) {
              operator_delete(args.
                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_first);
            }
            if ((size_t *)__str.field_2._8_8_ !=
                &args.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size) {
              operator_delete((void *)__str.field_2._8_8_);
            }
            if (local_200 != (_Elt_pointer)local_1f0) {
              operator_delete(local_200);
            }
            if ((undefined1 *)input.field_2._8_8_ != &local_210) {
              operator_delete((void *)input.field_2._8_8_);
            }
            if (local_58 != (undefined1  [8])&vName._M_string_length) {
              operator_delete((void *)local_58);
            }
            (*(runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Runtime[0xc])
                      (runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,interactiveInstanceId,local_a8,local_240);
            if (local_a8 != (undefined1  [8])&verb._M_string_length) {
              operator_delete((void *)local_a8);
            }
            LOCK();
            interruptionState._M_i = Acceptable;
            UNLOCK();
            runUntilBreak();
            LOCK();
            interruptionState._M_i = Masked;
            UNLOCK();
            __val = __val + 1;
          }
        }
LAB_00114a07:
        if (local_240 != (undefined1  [8])&input._M_string_length) {
          operator_delete((void *)local_240);
        }
        uVar43 = 1;
      }
      else {
        line._M_dataplus._M_p = (pointer)0x0;
        *(undefined1 *)subLine.field_2._8_8_ = 0;
      }
      bVar12 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)local_a8,(ulong)local_1e0);
      plVar17 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_a8,(ulong)verb._M_dataplus._M_p,0,'\x01');
      __str.field_2._8_8_ =
           &args.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
      psVar32 = (size_t *)(plVar17 + 2);
      if ((size_t *)*plVar17 == psVar32) {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar32;
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)plVar17[3];
      }
      else {
        args.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = *psVar32;
        __str.field_2._8_8_ = (size_t *)*plVar17;
      }
      args.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)plVar17[1];
      *plVar17 = (long)psVar32;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::_M_append(subLine.field_2._M_local_buf + 8,__str.field_2._8_8_);
      if ((size_t *)__str.field_2._8_8_ !=
          &args.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size) {
        operator_delete((void *)__str.field_2._8_8_);
      }
      if (local_a8 != (undefined1  [8])&verb._M_string_length) {
        operator_delete((void *)local_a8);
      }
      bVar12 = true;
    }
    if (local_1e0 != (undefined1  [8])&subLine._M_string_length) {
      operator_delete((void *)local_1e0);
    }
  } while( true );
}

Assistant:

[[noreturn]] static void interactiveMode() {
	std::signal(SIGINT, signalHandler);

	rl_bind_key('\t', rl_insert);
	stifle_history(1000);

	interactiveInstanceId = runtime->createInteractiveInstance();

	dLog(0, "Chatra interactive frontend");
	dLog(0, "type \"!h\" to show debugger command help");

	unsigned sectionNo = 0;
	unsigned lineNo = 1;
	std::string lines;
	std::string line;
	bool lineContinuation = false;
	bool blockContinuation = false;

	for (;;) {
		auto buffer = readline(prompt(blockContinuation, lineContinuation, sectionNo, lineNo));
		auto length = std::strlen(buffer);
		lineNo++;

		unsigned lineIndent = 0;
		for (size_t i = 0; i < length; i++) {
			if (buffer[i] == '\t')
				lineIndent++;
			else if (i + 3 < length && buffer[i] == ' ' && buffer[i + 1] == ' ' && buffer[i + 2] == ' ' && buffer[i + 3] == ' ') {
				lineIndent++;
				i += 3;
			}
		}

		auto subLine = std::string(buffer, length);

		if (lineContinuation) {
			for (unsigned i = 0; i < lineIndent + 2; i++)
				subLine.insert(subLine.cbegin(), '\t');
		}

		if (subLine.cend() != std::find_if(subLine.cbegin(), subLine.cend(), [](char c) {
				return cha::isNotSpace(c) && c != '\n';  })) {
			add_history(const_cast<char*>(subLine.data()));
		}

		if (subLine.empty() || subLine.back() != '\n')  // may be always true
			subLine += '\n';

		if (subLine.size() >= 2 && subLine[subLine.size() - 2] == '\\') {
			lineContinuation = true;
			line += subLine.substr(0, subLine.size() - 2) + '\n';
			continue;
		}
		else {
			lineContinuation = false;
			line += subLine;
		}

		// Remove line continuation marker when it comes from history and
		// contains wrapped line
		for (;;) {
			auto pos = line.find("\\\n");
			if (pos == std::string::npos)
				break;
			line.erase(pos, 1);
		}

		lines += line;
		if (blockContinuation) {
			if (line.size() <= 1)
				blockContinuation = false;
			else {
				line.clear();
				continue;
			}
		}
		else {
			auto it = std::find_if(line.cbegin(), line.cend(), cha::isNotSpace);
			if (isBlockStatement(std::string(it, line.cend()))) {
				blockContinuation = true;
				line.clear();
				continue;
			}
		}
		line.clear();
		auto input = lines.substr(std::distance(lines.cbegin(), std::find_if(lines.cbegin(), lines.cend(), cha::isNotSpace)));
		lines.clear();
		lineNo = 1;

		if (input.cend() == std::find_if(input.cbegin(), input.cend(), [](char c) {
				return cha::isNotSpace(c) && c != '\n';  })) {
			continue;
		}

		if (input[0] == '!') {
			processDebuggerCommand(input);
			continue;
		}

		auto t0Length = findToken(input);
		if (t0Length != 0) {
			auto firstToken = input.substr(0, t0Length);
			if (firstToken == "catch" || firstToken == "finally") {
				dError("warning: %s block on top-level was ignored since it has no effect in interactive mode.",
						firstToken.data());
				continue;
			}
		}

		try {
			auto scriptName = "chatra[" + std::to_string(sectionNo++) + "]";
			host->push("", {{scriptName, input}});
			runtime->push(interactiveInstanceId, scriptName, input);
		}
		catch (const cha::NativeException& ex) {
			dError("interactive mode: %s", ex.what() == nullptr ? "error" : ex.what());
			continue;
		}

		interruptible([&]() {
			runUntilBreak();
		});
	}
}